

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O0

void presolve::dev_kkt_check::checkDualFeasibility(State *state,KktConditionDetails *details)

{
  double dVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  ostream *poVar4;
  void *pvVar5;
  undefined4 *in_RSI;
  int *in_RDI;
  vector<double,_std::allocator<double>_> *this;
  double extraout_XMM0_Qa;
  double infeas_1;
  double rowV;
  int i_1;
  double infeas;
  int i;
  double local_38;
  int local_24;
  double local_20;
  int local_14;
  
  *in_RSI = 1;
  in_RSI[6] = 0;
  in_RSI[7] = 0;
  *(undefined8 *)(in_RSI + 2) = 0;
  *(undefined8 *)(in_RSI + 4) = 0;
  local_14 = 0;
  do {
    if (*in_RDI <= local_14) {
      for (local_24 = 0; local_24 < in_RDI[1]; local_24 = local_24 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x1c),(long)local_24);
        if (*pvVar2 != 0) {
          in_RSI[6] = in_RSI[6] + 1;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x22),
                              (long)local_24);
          dVar1 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x16),
                              (long)local_24);
          if ((1e-07 <= ABS(*pvVar3 - dVar1)) ||
             (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x18),
                                  (long)local_24), 1e-07 <= ABS(*pvVar3 - dVar1))) {
            local_38 = 0.0;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x16),
                                (long)local_24);
            if ((1e-07 <= ABS(*pvVar3 - dVar1)) ||
               (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x18),
                                    (long)local_24), *pvVar3 <= dVar1)) {
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x16),
                                  (long)local_24);
              if ((dVar1 <= *pvVar3) ||
                 (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x18),
                                      (long)local_24), 1e-07 <= ABS(dVar1 - *pvVar3))) {
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x16),
                                    (long)local_24);
                if ((*pvVar3 < dVar1 + 1e-07) &&
                   ((pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (*(vector<double,_std::allocator<double>_> **)
                                          (in_RDI + 0x18),(long)local_24), dVar1 < *pvVar3 + 1e-07
                    && (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                           (*(vector<double,_std::allocator<double>_> **)
                                             (in_RDI + 0x24),(long)local_24), 1e-07 < ABS(*pvVar3)))
                   )) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
                  poVar4 = std::operator<<(poVar4,": L= ");
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x16),
                                      (long)local_24);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
                  poVar4 = std::operator<<(poVar4,", Ax=");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
                  poVar4 = std::operator<<(poVar4,", U=");
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x18),
                                      (long)local_24);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
                  poVar4 = std::operator<<(poVar4,", y=");
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                                      (long)local_24);
                  pvVar5 = (void *)std::ostream::operator<<(poVar4,*pvVar3);
                  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
                  this = *(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24);
                  std::vector<double,_std::allocator<double>_>::operator[](this,(long)local_24);
                  std::abs((int)this);
                  local_38 = extraout_XMM0_Qa;
                }
              }
              else {
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                                    (long)local_24);
                if (1e-07 < *pvVar3) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
                  poVar4 = std::operator<<(poVar4,": L= ");
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x16),
                                      (long)local_24);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
                  poVar4 = std::operator<<(poVar4,", Ax=");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
                  poVar4 = std::operator<<(poVar4,", U=");
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x18),
                                      (long)local_24);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
                  poVar4 = std::operator<<(poVar4,", y=");
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                                      (long)local_24);
                  pvVar5 = (void *)std::ostream::operator<<(poVar4,*pvVar3);
                  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
                  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                                      (long)local_24);
                  local_38 = *pvVar3;
                }
              }
            }
            else {
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                                  (long)local_24);
              if (*pvVar3 <= -1e-07 && *pvVar3 != -1e-07) {
                poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
                poVar4 = std::operator<<(poVar4,": L= ");
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x16),
                                    (long)local_24);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
                poVar4 = std::operator<<(poVar4,", Ax=");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
                poVar4 = std::operator<<(poVar4,", U=");
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x18),
                                    (long)local_24);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
                poVar4 = std::operator<<(poVar4,", y=");
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                                    (long)local_24);
                pvVar5 = (void *)std::ostream::operator<<(poVar4,*pvVar3);
                std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
                pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x24),
                                    (long)local_24);
                local_38 = -*pvVar3;
              }
            }
            if (0.0 < local_38) {
              in_RSI[7] = in_RSI[7] + 1;
              *(double *)(in_RSI + 4) = local_38 * local_38 + *(double *)(in_RSI + 4);
              if (*(double *)(in_RSI + 2) < local_38) {
                *(double *)(in_RSI + 2) = local_38;
              }
            }
          }
        }
      }
      if (in_RSI[7] == 0) {
        std::operator<<((ostream *)&std::cout,"Dual feasible.\n");
      }
      else {
        std::operator<<((ostream *)&std::cout,"KKT check error: Dual feasibility fail.\n");
      }
      return;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (*(vector<int,_std::allocator<int>_> **)(in_RDI + 0x1a),(long)local_14);
    if (*pvVar2 != 0) {
      in_RSI[6] = in_RSI[6] + 1;
      local_20 = 0.0;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x12),
                          (long)local_14);
      if ((-INFINITY < *pvVar3) ||
         (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x14),
                              (long)local_14), *pvVar3 < INFINITY)) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x1e),
                            (long)local_14);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x12),
                            (long)local_14);
        if ((dVar1 == *pvVar3) && (!NAN(dVar1) && !NAN(*pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x12),
                              (long)local_14);
          dVar1 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x14),
                              (long)local_14);
          if (dVar1 < *pvVar3) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                                (long)local_14);
            if ((*pvVar3 <= 0.0 && *pvVar3 != 0.0) &&
               (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                                    (long)local_14), 1e-07 < ABS(*pvVar3))) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: l[");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
              poVar4 = std::operator<<(poVar4,"]=");
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x12),
                                  (long)local_14);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
              poVar4 = std::operator<<(poVar4," = x[");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
              poVar4 = std::operator<<(poVar4,"]=");
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x1e),
                                  (long)local_14);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
              poVar4 = std::operator<<(poVar4,", z[");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
              poVar4 = std::operator<<(poVar4,"]=");
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                                  (long)local_14);
              pvVar5 = (void *)std::ostream::operator<<(poVar4,*pvVar3);
              std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                                  (long)local_14);
              local_20 = ABS(*pvVar3);
            }
            goto LAB_007c5c92;
          }
        }
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x1e),
                            (long)local_14);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x14),
                            (long)local_14);
        if ((dVar1 == *pvVar3) && (!NAN(dVar1) && !NAN(*pvVar3))) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x12),
                              (long)local_14);
          dVar1 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x14),
                              (long)local_14);
          if ((dVar1 < *pvVar3) &&
             (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                                  (long)local_14), 1e-07 < *pvVar3)) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: x[");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
            poVar4 = std::operator<<(poVar4,"]=");
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x1e),
                                (long)local_14);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
            poVar4 = std::operator<<(poVar4,"=u[");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
            poVar4 = std::operator<<(poVar4,"], z[");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
            poVar4 = std::operator<<(poVar4,"]=");
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                                (long)local_14);
            pvVar5 = (void *)std::ostream::operator<<(poVar4,*pvVar3);
            std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                                (long)local_14);
            local_20 = ABS(*pvVar3);
          }
        }
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                            (long)local_14);
        if (1e-07 < ABS(*pvVar3)) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: l=-inf, x[");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
          poVar4 = std::operator<<(poVar4,"]=");
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x1e),
                              (long)local_14);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
          poVar4 = std::operator<<(poVar4,", u=inf, z[");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
          poVar4 = std::operator<<(poVar4,"]=");
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                              (long)local_14);
          pvVar5 = (void *)std::ostream::operator<<(poVar4,*pvVar3);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x20),
                              (long)local_14);
          local_20 = ABS(*pvVar3);
        }
      }
LAB_007c5c92:
      if (0.0 < local_20) {
        in_RSI[7] = in_RSI[7] + 1;
        *(double *)(in_RSI + 4) = local_20 * local_20 + *(double *)(in_RSI + 4);
        if (*(double *)(in_RSI + 2) < local_20) {
          *(double *)(in_RSI + 2) = local_20;
        }
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void checkDualFeasibility(const State& state, KktConditionDetails& details) {
  details.type = KktCondition::kPrimalFeasibility;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  // check values of z_j are dual feasible
  for (int i = 0; i < state.numCol; i++) {
    if (state.flagCol[i]) {
      details.checked++;
      double infeas = 0;
      // j not in L or U
      if (state.colLower[i] <= -kHighsInf && state.colUpper[i] >= kHighsInf) {
        if (fabs(state.colDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: l=-inf, x[" << i
                      << "]=" << state.colValue[i] << ", u=inf, z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }
      // j in L: x=l and l<u
      else if (state.colValue[i] == state.colLower[i] &&
               state.colLower[i] < state.colUpper[i]) {
        if (state.colDual[i] < 0 && fabs(state.colDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: l[" << i
                      << "]=" << state.colLower[i] << " = x[" << i
                      << "]=" << state.colValue[i] << ", z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }
      // j in U: x=u and l<u
      else if (state.colValue[i] == state.colUpper[i] &&
               state.colLower[i] < state.colUpper[i]) {
        if (state.colDual[i] > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: x[" << i
                      << "]=" << state.colValue[i] << "=u[" << i << "], z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  // check values of y_i are dual feasible
  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;

      double rowV = state.rowValue[i];

      // L = Ax = U can be any sign
      if (fabs(state.rowLower[i] - rowV) < tol &&
          fabs(state.rowUpper[i] - rowV) < tol)
        continue;

      double infeas = 0;
      // L = Ax < U
      if (fabs(state.rowLower[i] - rowV) < tol && rowV < state.rowUpper[i]) {
        if (state.rowDual[i] < -tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = -state.rowDual[i];
        }
      }
      // L < Ax = U
      else if (state.rowLower[i] < rowV &&
               fabs(rowV - state.rowUpper[i]) < tol) {
        if (state.rowDual[i] > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = state.rowDual[i];
        }
      }
      // L < Ax < U
      else if ((state.rowLower[i] < (rowV + tol)) &&
               (rowV < (state.rowUpper[i] + tol))) {
        if (fabs(state.rowDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = std::abs(state.rowDual[i]);
        }
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Dual feasible.\n";
  } else {
    if (dev_print == 1)
      std::cout << "KKT check error: Dual feasibility fail.\n";
  }
}